

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O3

void __thiscall FIX::SocketMonitor::~SocketMonitor(SocketMonitor *this)

{
  _Rb_tree_node_base *p_Var1;
  
  this->_vptr_SocketMonitor = (_func_int **)&PTR__SocketMonitor_001f7810;
  for (p_Var1 = (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_readSockets)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    socket_close(p_Var1[1]._M_color);
  }
  socket_close(this->m_signal);
  socket_term();
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&this->m_dropped);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->m_writeSockets)._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->m_readSockets)._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&(this->m_connectSockets)._M_t);
  return;
}

Assistant:

SocketMonitor::~SocketMonitor() {
  Sockets::iterator i;
  for (i = m_readSockets.begin(); i != m_readSockets.end(); ++i) {
    socket_close(*i);
  }

  socket_close(m_signal);
  socket_term();
}